

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void GameLoop(Board *board)

{
  int iVar1;
  ulong uVar2;
  char choice;
  int frames;
  char local_39;
  int local_38;
  uint local_34;
  
  system("clear");
  Board::PrintBoard(board);
  uVar2 = 0;
  do {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1070d0);
    std::istream::ignore((long)&std::cin,1000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"(n)ext iteration / (s)pecify frames to advance, / e(x)it: ",
               0x3a);
    std::operator>>((istream *)&std::cin,&local_39);
    if (local_39 == 'x') {
      uVar2 = CONCAT71((int7)(uVar2 >> 8),1);
    }
    else if (local_39 == 's') {
      local_34 = (uint)uVar2;
      local_38 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Enter the number of frames you would like to advance: ",0x36
                );
      std::istream::operator>>((istream *)&std::cin,&local_38);
      if (0 < local_38) {
        iVar1 = 0;
        do {
          Board::Tick(board);
          system("clear");
          Board::PrintBoard(board);
          usleep(100000);
          iVar1 = iVar1 + 1;
        } while (iVar1 < local_38);
      }
      uVar2 = (ulong)local_34;
    }
    else if (local_39 == 'n') {
      Board::Tick(board);
      system("clear");
      Board::PrintBoard(board);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Invalid selection. Please try again.",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
  } while ((uVar2 & 1) == 0);
  return;
}

Assistant:

void GameLoop(Board &board)
{
    system("clear");
    board.PrintBoard();
    bool exit = false;
    do
    {
        char choice;

        //Just in case the user entered extra/invalid input
        std::cin.clear();
        std::cin.ignore(1000, '\n');

        std::cout << "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ";
        std::cin >> choice;
        switch(choice)
        {
            case 'n':
                board.Tick();
                system("clear");
                board.PrintBoard();
                break;
            case 's':
            {
                int frames = 1;
                std::cout << "Enter the number of frames you would like to advance: ";
                std::cin >> frames;
                for (int x = 0; x < frames; x++)
                {
                    board.Tick();
                    system("clear");
                    board.PrintBoard();
                    usleep(100000);
                }
                break;
            }
            case 'x':
                exit = true;
                break;
            default:
                std::cout << "Invalid selection. Please try again." << std::endl;
                break;
        }
    } while(!exit);
}